

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall Catch::RunContext::testForMissingAssertions(RunContext *this,Counts *assertions)

{
  size_t *psVar1;
  int iVar2;
  
  if (assertions->failed + assertions->passed + assertions->failedButOk != 0) {
    return false;
  }
  iVar2 = (*(((this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_NonCopyable)._vptr_NonCopyable[7])();
  if (((char)iVar2 != '\0') &&
     (iVar2 = (*((this->m_trackerContext).m_currentTracker)->_vptr_ITracker[5])(),
     (char)iVar2 == '\0')) {
    psVar1 = &(this->m_totals).assertions.failed;
    *psVar1 = *psVar1 + 1;
    assertions->failed = assertions->failed + 1;
    return true;
  }
  return false;
}

Assistant:

std::size_t Counts::total() const {
        return passed + failed + failedButOk;
    }